

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

FuncVec * __thiscall
dg::llvmdg::DGCallGraphImpl::callees
          (FuncVec *__return_storage_ptr__,DGCallGraphImpl *this,Function *F)

{
  long *plVar1;
  iterator iVar2;
  FuncNode *pFVar3;
  long *plVar4;
  Function *local_30;
  Function *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = F;
  iVar2 = std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
          ::find(&(this->_mapping)._M_t,&local_28);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_mapping)._M_t._M_impl.super__Rb_tree_header) {
    pFVar3 = GenericCallGraph<dg::pta::PSNode_*>::get
                       (this->_cg,(PSNode **)&iVar2._M_node[1]._M_parent);
    plVar1 = *(long **)(pFVar3 + 0x10);
    for (plVar4 = *(long **)(pFVar3 + 8); plVar4 != plVar1; plVar4 = plVar4 + 1) {
      local_30 = *(Function **)(*(long *)(*plVar4 + 0x38) + 0x18);
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      emplace_back<llvm::Function_const*>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 __return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return ret;
        const auto *fnd = _cg.get(it->second);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(getFunFromNode(nd->getValue()));
        }
        return ret;
    }